

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saig.h
# Opt level: O1

Aig_Obj_t * Saig_ObjLoToLi(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  
  if (((*(uint *)&pObj->field_0x18 & 7) != 2) || ((pObj->field_0).CioId < p->nTruePis)) {
    __assert_fail("Saig_ObjIsLo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                  ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
  }
  uVar1 = ((pObj->field_0).CioId + p->nTruePos) - p->nTruePis;
  if ((-1 < (int)uVar1) && ((int)uVar1 < p->vCos->nSize)) {
    return (Aig_Obj_t *)p->vCos->pArray[uVar1];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline Aig_Obj_t *  Saig_ObjLoToLi( Aig_Man_t * p, Aig_Obj_t * pObj )  { assert(Saig_ObjIsLo(p, pObj)); return (Aig_Obj_t *)Vec_PtrEntry(p->vCos, Saig_ManPoNum(p)+Aig_ObjCioId(pObj)-Saig_ManPiNum(p));   }